

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O2

void __thiscall MyServerConnection::OnTick(MyServerConnection *this,uint64_t nowUsec)

{
  ostringstream *poVar1;
  TonkFile pTVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  OutputWorker *pOVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  TonkStatusEx local_220;
  LogStringBuffer local_1a0;
  undefined1 auVar7 [16];
  
  auVar6 = in_ZMM0._0_16_;
  if (this->File == (TonkFile)0x0) {
    return;
  }
  tonk_file_send(this->File);
  pTVar2 = this->File;
  if ((pTVar2->Flags & 1) == 0) {
    if (nowUsec - this->LastReportUsec < 0xf4241) {
      return;
    }
    this->LastReportUsec = nowUsec;
    auVar6 = vcvtusi2ss_avx512f(auVar6,pTVar2->TotalBytes);
    uVar3 = pTVar2->ProgressBytes;
    tonk::SDKConnection::GetStatusEx(&local_220,&this->super_SDKConnection);
    if (2 < (int)Logger.ChannelMinLevel) {
      return;
    }
    auVar4 = vcvtusi2sd_avx512f(in_XMM1,local_220.PeerSeenBPS);
    poVar1 = &local_1a0.LogStream;
    local_1a0.ChannelName = Logger.ChannelName;
    local_1a0.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    auVar7._8_8_ = extraout_XMM1_Qb;
    auVar7._0_8_ = extraout_XMM1_Qa;
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"File(");
    std::operator<<((ostream *)poVar1,pTVar2->Name);
    std::operator<<((ostream *)poVar1,") progress: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," / ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," Bytes (");
    auVar7 = vcvtusi2ss_avx512f(auVar7,uVar3 * 100);
    std::ostream::operator<<((ostream *)poVar1,auVar7._0_4_ / auVar6._0_4_);
    std::operator<<((ostream *)poVar1,"%).  Received by peer at ");
    std::ostream::_M_insert<double>(auVar4._0_8_ / 1000.0);
    std::operator<<((ostream *)poVar1," KBPS");
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,&local_1a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    return;
  }
  if ((pTVar2->Flags & 2) == 0) {
    if (2 < (int)Logger.ChannelMinLevel) goto LAB_0010396c;
    poVar1 = &local_1a0.LogStream;
    local_1a0.ChannelName = Logger.ChannelName;
    local_1a0.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"File transfer completed");
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,&local_1a0);
  }
  else {
    if (4 < (int)Logger.ChannelMinLevel) goto LAB_0010396c;
    poVar1 = &local_1a0.LogStream;
    local_1a0.ChannelName = Logger.ChannelName;
    local_1a0.LogLevel = Error;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"File transfer failed");
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,&local_1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0.LogStream);
LAB_0010396c:
  tonk_file_free(this->File);
  this->File = (TonkFile)0x0;
  return;
}

Assistant:

void MyServerConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (File)
    {
        tonk_file_send(File);

        // If transfer is done we need to call tonk_file_free().
        if (File->Flags & TonkFileFlags_Done)
        {
            if (File->Flags & TonkFileFlags_Failed) {
                Logger.Error("File transfer failed");
            }
            else {
                Logger.Info("File transfer completed");
            }

            tonk_file_free(File);
            File = nullptr;

            // Start sending the next file
            //StartSending();
        }

        // Periodically report progress
        if (File && nowUsec - LastReportUsec > 1000000)
        {
            LastReportUsec = nowUsec;

            Logger.Info("File(", File->Name, ") progress: ", File->ProgressBytes, " / ", File->TotalBytes,
                " Bytes (", File->ProgressBytes * 100 / (float)File->TotalBytes,
                "%).  Received by peer at ", GetStatusEx().PeerSeenBPS / 1000.0, " KBPS");
        }
    }
}